

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall asl::LocalSocket_::bind(LocalSocket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *pcVar1;
  int iVar2;
  sockaddr *extraout_RAX;
  undefined4 in_register_00000034;
  String *host_port;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  InetAddress local_30;
  
  host_port = (String *)CONCAT44(in_register_00000034,__fd);
  if (host_port->_size == 0) {
    __name = &host_port->field_2;
  }
  else {
    __name = (anon_union_16_2_78e7fdac_for_String_2 *)(host_port->field_2)._str;
  }
  unlink(__name->_space);
  Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  InetAddress::InetAddress(&local_30,host_port);
  iVar2 = ::bind(*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc,
                 (sockaddr *)local_30._data._a,0x6e);
  if (iVar2 != 0) {
    (this->super_Socket_)._error = 8;
  }
  LOCK();
  pcVar1 = (char *)(local_30._data._a + -8);
  *(int *)pcVar1 = *(int *)pcVar1 + -1;
  UNLOCK();
  if (*(int *)pcVar1 == 0) {
    free((sockaddr *)(local_30._data._a + -0x10));
    local_30._data._a = (uchar *)extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)local_30._data._a >> 8),iVar2 == 0);
}

Assistant:

bool LocalSocket_::bind(const String& name)
{
#ifdef ASL_SOCKET_LOCAL
#ifdef _WIN32
	DeleteFileW(name);
#else
	unlink(name);
#endif
	init();
	InetAddress here(name);
	if (::bind(_handle, (sockaddr*)here.ptr(), sizeof(sockaddr_un)))
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
#else
	asl_error("Unix sockets not supported");
	_error = SOCKET_BAD_BIND;
	return false;
#endif
}